

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_hash.c
# Opt level: O0

uint64_t CWhash(uint64_t x)

{
  uint64_t uVar1;
  uint64_t local_1a8;
  INT96 r;
  uint64_t local_188;
  INT96 L;
  uint64_t local_168;
  INT96 K;
  uint64_t local_148;
  INT96 J;
  uint64_t local_128;
  INT96 I;
  uint64_t local_108;
  INT96 H;
  uint64_t local_e8;
  INT96 G;
  uint64_t local_c8;
  INT96 F;
  uint64_t local_a8;
  INT96 E;
  uint64_t local_88;
  INT96 D;
  uint64_t local_68;
  INT96 C;
  uint64_t local_48;
  INT96 B;
  uint64_t local_28;
  INT96 A;
  uint64_t x_local;
  
  local_28 = 0xcf90094b0ab9939e;
  A[0] = 0x817f998697604ff3;
  A[1] = 0x1a6e6f08b65440ea;
  local_48 = 0xb989a05a5dcf57f1;
  B[0] = 0x7c007611f28daee7;
  B[1] = 0xd8bd809d68c26854;
  local_68 = 0x1041070633a92679;
  C[0] = 0xba9379fd71cd939d;
  C[1] = 0x271793709e1cd781;
  local_88 = 0x5c240a710b0c6beb;
  D[0] = 0xc24ac3b68056ea1c;
  D[1] = 0xd46c9c7f2adfaf71;
  local_a8 = 0xa527cea74b053a87;
  E[0] = 0x69ba4a5e23f90577;
  E[1] = 0x707b6e053c7741e7;
  local_c8 = 0xa6c0812cdbcdb982;
  F[0] = 0x8cb0c8b73f701489;
  F[1] = 0xee08c4dc1dbef243;
  local_e8 = 0xcf3ab0ec9d538853;
  G[0] = 0x982a8457b6db03a9;
  G[1] = 0x8659cf6b636c9d37;
  local_108 = 0x905d5d14efefc0dd;
  H[0] = 0x7e9870e018ead6a2;
  H[1] = 0x47e2c9af0ea9325a;
  local_128 = 0xc59351a9bf283b09;
  I[0] = 0x4a39e35dbc280c7f;
  I[1] = 0xc5f160732996be4f;
  local_148 = 0x4d58e0b7a57ccddf;
  J[0] = 0xc362a25c267d1db4;
  J[1] = 0x7c79d2fcd89402b2;
  local_168 = 0x62ac342c4393930c;
  K[0] = 0xdb2fd2740ebef2a0;
  K[1] = 0xc672fd5e72921377;
  local_188 = 0xbdae267838862c6d;
  L[0] = 0xe0ee206fdbaf1d1;
  L[1] = 0xc270e26fd8dfbae7;
  A[2] = x;
  MultAddPrime89(&local_1a8,x,&local_28,&local_48);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_68);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_88);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_a8);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_c8);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_e8);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_108);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_128);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_148);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_168);
  MultAddPrime89(&local_1a8,A[2],&local_1a8,&local_188);
  uVar1 = Mod64Prime89(&local_1a8);
  return uVar1;
}

Assistant:

static uint64_t
CWhash(uint64_t x)
{
    INT96 A = {0xcf90094b0ab9939e, 0x817f998697604ff3, 0x1a6e6f08b65440ea};
    INT96 B = {0xb989a05a5dcf57f1, 0x7c007611f28daee7, 0xd8bd809d68c26854};
    INT96 C = {0x1041070633a92679, 0xba9379fd71cd939d, 0x271793709e1cd781};
    INT96 D = {0x5c240a710b0c6beb, 0xc24ac3b68056ea1c, 0xd46c9c7f2adfaf71};
    INT96 E = {0xa527cea74b053a87, 0x69ba4a5e23f90577, 0x707b6e053c7741e7};
    INT96 F = {0xa6c0812cdbcdb982, 0x8cb0c8b73f701489, 0xee08c4dc1dbef243};
    INT96 G = {0xcf3ab0ec9d538853, 0x982a8457b6db03a9, 0x8659cf6b636c9d37};
    INT96 H = {0x905d5d14efefc0dd, 0x7e9870e018ead6a2, 0x47e2c9af0ea9325a};
    INT96 I = {0xc59351a9bf283b09, 0x4a39e35dbc280c7f, 0xc5f160732996be4f};
    INT96 J = {0x4d58e0b7a57ccddf, 0xc362a25c267d1db4, 0x7c79d2fcd89402b2};
    INT96 K = {0x62ac342c4393930c, 0xdb2fd2740ebef2a0, 0xc672fd5e72921377};
    INT96 L = {0xbdae267838862c6d, 0x0e0ee206fdbaf1d1, 0xc270e26fd8dfbae7};

    INT96 r;
    MultAddPrime89(r, x, A, B);
    MultAddPrime89(r, x, r, C);
    MultAddPrime89(r, x, r, D);
    MultAddPrime89(r, x, r, E);
    MultAddPrime89(r, x, r, F);
    MultAddPrime89(r, x, r, G);
    MultAddPrime89(r, x, r, H);
    MultAddPrime89(r, x, r, I);
    MultAddPrime89(r, x, r, J);
    MultAddPrime89(r, x, r, K);
    MultAddPrime89(r, x, r, L);
    return Mod64Prime89(r);
}